

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_display_keylog(command_conflict *cmd)

{
  ulong uVar1;
  keycode_t local_8c;
  keypress k;
  wchar_t j;
  keypress keys [2];
  char local_54 [8];
  char buf2 [12];
  char buf [50];
  wchar_t i;
  command_conflict *cmd_local;
  
  memset(&k.mods,0,0x18);
  screen_save();
  prt("Previous keypresses (top most recent):",L'\0',L'\0');
  buf[0x2c] = '\0';
  buf[0x2d] = '\0';
  buf[0x2e] = '\0';
  buf[0x2f] = '\0';
  for (; (int)buf._44_4_ < 8; buf._44_4_ = buf._44_4_ + 1) {
    if ((int)buf._44_4_ < log_size) {
      if ((int)buf._44_4_ < log_i) {
        local_8c = (log_i - buf._44_4_) - 1;
      }
      else {
        local_8c = (log_i - buf._44_4_) + 7;
      }
      k.code = local_8c;
      uVar1._0_4_ = keylog[(int)local_8c].type;
      uVar1._4_4_ = keylog[(int)local_8c].code;
      k.type = *(ui_event_type *)&keylog[(int)local_8c].mods;
      unique0x100001ef = uVar1;
      keypress_to_text(local_54,0xc,(keypress *)&k.mods,true);
      strnfmt(buf2 + 4,0x32,"    %-12s (code=%lu mods=%u)",local_54,uVar1 >> 0x20,
              (ulong)(byte)(undefined1)k.type);
    }
    else {
      strnfmt(buf2 + 4,0x32,"%40s","");
    }
    prt(buf2 + 4,buf._44_4_ + L'\x01',L'\0');
  }
  prt("Press any key to continue.",L'\t',L'\0');
  anykey();
  screen_load();
  return;
}

Assistant:

void do_cmd_wiz_display_keylog(struct command *cmd)
{
	int i;
	char buf[50];
	char buf2[12];
	struct keypress keys[2] = {KEYPRESS_NULL, KEYPRESS_NULL};

	screen_save();

	prt("Previous keypresses (top most recent):", 0, 0);

	for (i = 0; i < KEYLOG_SIZE; i++) {
		if (i < log_size) {
			/*
			 * Find the keypress from the log; log_i is one past
			 * the most recent.
			 */
			int j = (log_i > i) ?
				log_i - i - 1 : log_i - i - 1 + KEYLOG_SIZE;
			struct keypress k = keylog[j];

			/*
			 * ugh. it would be nice if there was a version of
			 * keypress_to_text which took only one keypress.
			 */
			keys[0] = k;
			keypress_to_text(buf2, sizeof(buf2), keys, true);

			/* format this line of output */
			strnfmt(buf, sizeof(buf), "    %-12s (code=%lu mods=%u)",
				buf2, (unsigned long)k.code, k.mods);
		} else {
			/* create a blank line of output */
			strnfmt(buf, sizeof(buf), "%40s", "");
		}

		prt(buf, i + 1, 0);
	}

	prt("Press any key to continue.", KEYLOG_SIZE + 1, 0);
	anykey();
	screen_load();
}